

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void * __thiscall mocker::ir::Interpreter::fastMalloc(Interpreter *this,size_t sz)

{
  ulong uVar1;
  void *res;
  int8_t *local_18;
  
  uVar1 = this->curSize + sz;
  if (sz < 0x81 && uVar1 < 0x8001) {
    local_18 = this->fastMem + this->curSize;
    this->curSize = uVar1;
  }
  else {
    local_18 = (int8_t *)malloc(sz);
    std::vector<void*,std::allocator<void*>>::emplace_back<void*&>
              ((vector<void*,std::allocator<void*>> *)&this->malloced,&local_18);
  }
  return local_18;
}

Assistant:

void *Interpreter::fastMalloc(std::size_t sz) {
  if (curSize + sz <= Capacity && sz <= 128) {
    auto res = (void *)(fastMem + curSize);
    curSize += sz;
    return res;
  }

  auto res = std::malloc(sz);
  malloced.emplace_back(res);
  return res;
}